

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

DIY_MPI_Win diy::mpi::detail::win_allocate(communicator *comm,void **base,uint size,int disp)

{
  DIY_MPI_Win win;
  MPI_Win local_10;
  
  MPI_Win_allocate(size,disp,&ompi_mpi_info_null,(comm->comm_).data,base,&local_10);
  return (DIY_MPI_Win)local_10;
}

Assistant:

DIY_MPI_Win win_allocate(const communicator& comm, void** base, unsigned size, int disp)
{
#if DIY_HAS_MPI
  DIY_MPI_Win win;
  MPI_Win_allocate(size, disp, MPI_INFO_NULL, mpi_cast(comm.handle()), base, &mpi_cast(win));
  return win;
#else
  (void)comm; (void)disp;
  *base = malloc(size);
  auto mpi_win = MPI_Win(*base, true);
  auto win = make_DIY_MPI_Win(std::move(mpi_win));
  return win;
#endif
}